

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator-debug.c
# Opt level: O1

int disassemble_instr(u8 *data,char *buffer,size_t size)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  char *pcVar4;
  uint uVar5;
  char hex [3] [3];
  char temp [80];
  undefined8 local_88;
  undefined1 local_80;
  char local_78 [88];
  
  bVar1 = *data;
  bVar2 = "\x01\x03\x01\x01\x01\x01\x02\x01\x03\x01\x01\x01\x01\x01\x02\x01\x01\x03\x01\x01\x01\x01\x02\x01\x02\x01\x01\x01\x01\x01\x02\x01\x02\x03\x01\x01\x01\x01\x02\x01\x02\x01\x01\x01\x01\x01\x02\x01\x02\x03\x01\x01\x01\x01\x02\x01\x02\x01\x01\x01\x01\x01\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x03\x01\x02\x01\x01\x01\x03\x02\x03\x03\x02\x01\x01\x01\x03\x01\x03\x01\x02\x01\x01\x01\x03\x01\x03\x01\x02\x01\x02\x01\x01\x01\x01\x01\x02\x01\x02\x01\x03\x01\x01\x01\x02\x01\x02\x01\x01\x01\x01\x01\x02\x01\x02\x01\x03\x01\x01\x01\x02\x01"
          [bVar1];
  if (bVar2 == 3) {
    pcVar4 = s_opcode_mnemonic[bVar1];
    uVar3 = (ulong)*(ushort *)(data + 1);
LAB_0019157e:
    snprintf(local_78,0x50,pcVar4,uVar3);
  }
  else {
    if (bVar2 == 2) {
      if (bVar1 != 0xcb) {
        pcVar4 = s_opcode_mnemonic[bVar1];
        uVar3 = (ulong)data[1];
        goto LAB_0019157e;
      }
      pcVar4 = s_cb_opcode_mnemonic[data[1]];
    }
    else {
      if (bVar2 != 1) {
        __assert_fail("!\"invalid opcode byte length.\\n\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/emulator-debug.c"
                      ,0x146,"int disassemble_instr(u8 *, char *, size_t)");
      }
      pcVar4 = "*INVALID*";
      if (s_opcode_mnemonic[bVar1] != (char *)0x0) {
        pcVar4 = s_opcode_mnemonic[bVar1];
      }
    }
    strncpy(local_78,pcVar4,0x4f);
  }
  local_88 = 0x2020002020002020;
  local_80 = 0;
  uVar5 = (uint)bVar2;
  if (bVar2 != 1) {
    if (uVar5 != 2) {
      if (uVar5 != 3) goto LAB_0019161a;
      local_88 = CONCAT17("0123456789abcdef"[data[2] & 0xf],
                          CONCAT16("0123456789abcdef"[data[2] >> 4],0x2020002020));
    }
    local_88 = (ulong)CONCAT32(local_88._5_3_,
                               CONCAT11("0123456789abcdef"[data[1] & 0xf],
                                        "0123456789abcdef"[data[1] >> 4])) << 0x18;
  }
  local_88._0_2_ = CONCAT11("0123456789abcdef"[*data & 0xf],"0123456789abcdef"[*data >> 4]);
LAB_0019161a:
  snprintf(buffer,size,"%s %s %s  %-15s",&local_88,(long)&local_88 + 3,(long)&local_88 + 6,local_78)
  ;
  return uVar5;
}

Assistant:

static int disassemble_instr(u8 data[3], char* buffer, size_t size) {
  char temp[80];
  u8 opcode = data[0];
  u8 num_bytes = s_opcode_bytes[opcode];
  switch (num_bytes) {
    case 1: {
      const char* mnemonic = s_opcode_mnemonic[opcode];
      if (!mnemonic) {
        mnemonic = "*INVALID*";
      }
      strncpy(temp, mnemonic, sizeof(temp) - 1);
      break;
    }
    case 2:
      if (opcode == 0xcb) {
        strncpy(temp, s_cb_opcode_mnemonic[data[1]], sizeof(temp) - 1);
      } else {
        snprintf(temp, sizeof(temp), s_opcode_mnemonic[opcode], data[1]);
      }
      break;
    case 3:
      snprintf(temp, sizeof(temp), s_opcode_mnemonic[opcode],
               (data[2] << 8) | data[1]);
      break;
    default: assert(!"invalid opcode byte length.\n"); break;
  }

  char hex[][3] = {"  ", "  ", "  "};
  switch (num_bytes) {
    case 3: sprint_hex(hex[2], data[2]); /* Fallthrough. */
    case 2: sprint_hex(hex[1], data[1]); /* Fallthrough. */
    case 1: sprint_hex(hex[0], data[0]); break;
  }

  snprintf(buffer, size, "%s %s %s  %-15s", hex[0], hex[1], hex[2], temp);
  return num_bytes;
}